

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O1

string * extract_generic_stream_partition_payload
                   (string *in_filename,ui32_t sid,string *out_filename,
                   IFileReaderFactory *fileReaderFactory)

{
  IFileReaderFactory *in_R8;
  ui32_t write_count;
  MXFReader reader;
  FrameBuffer payload;
  FileWriter writer;
  MXFReader local_100 [16];
  FrameBuffer local_f0 [8];
  uint *local_e8;
  Result_t local_c8 [104];
  FileWriter local_60 [56];
  
  ASDCP::FrameBuffer::FrameBuffer(local_f0);
  AS_02::ISXD::MXFReader::MXFReader(local_100,in_R8);
  AS_02::ISXD::MXFReader::OpenRead((string *)in_filename);
  if (-1 < *(int *)&(in_filename->_M_dataplus)._M_p) {
    AS_02::ISXD::MXFReader::ReadGenericStreamPartitionPayload
              ((uint)local_c8,(FrameBuffer *)local_100);
    Kumu::Result_t::operator=((Result_t *)in_filename,local_c8);
    Kumu::Result_t::~Result_t(local_c8);
  }
  if (-1 < *(int *)&(in_filename->_M_dataplus)._M_p) {
    Kumu::FileWriter::FileWriter(local_60);
    Kumu::FileWriter::OpenWrite((string *)local_c8);
    Kumu::Result_t::operator=((Result_t *)in_filename,local_c8);
    Kumu::Result_t::~Result_t(local_c8);
    if (-1 < *(int *)&(in_filename->_M_dataplus)._M_p) {
      Kumu::FileWriter::Write((uchar *)local_c8,(uint)local_60,local_e8);
      Kumu::Result_t::operator=((Result_t *)in_filename,local_c8);
      Kumu::Result_t::~Result_t(local_c8);
    }
    Kumu::FileWriter::~FileWriter(local_60);
  }
  AS_02::ISXD::MXFReader::~MXFReader(local_100);
  ASDCP::FrameBuffer::~FrameBuffer(local_f0);
  return in_filename;
}

Assistant:

Result_t
extract_generic_stream_partition_payload(const std::string& in_filename, const ui32_t sid, const std::string& out_filename, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  ASDCP::FrameBuffer payload;
  AS_02::ISXD::MXFReader reader(fileReaderFactory);

  Result_t result = reader.OpenRead(in_filename);
          
  if ( KM_SUCCESS(result) )
    {
      result = reader.ReadGenericStreamPartitionPayload(sid, payload);
    }
  
  if ( KM_SUCCESS(result) )
    {
      Kumu::FileWriter writer;
      ui32_t write_count = 0;
      result = writer.OpenWrite(out_filename);
      
      if ( KM_SUCCESS(result) )
	{
	  result = writer.Write(payload.RoData(), payload.Size(), &write_count);
	}
    }

  return result;
}